

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O2

void __thiscall NNTreeIterator::increment(NNTreeIterator *this,bool backward)

{
  QPDFObjectHandle *key;
  list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_> *this_00;
  NNTreeDetails *pNVar1;
  QPDF *pQVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  NNTreeIterator *this_01;
  QPDFObjectHandle QVar7;
  QPDFObjectHandle items;
  QPDFObjectHandle pe_node;
  QPDFObjectHandle local_a0;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_90;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  
  iVar5 = this->item_number;
  if (iVar5 < 0) {
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_80,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&this->impl->oh);
    deepen(this,(QPDFObjectHandle *)&local_80,!backward,true);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
  }
  else {
    key = &this->node;
    this_00 = &this->path;
    bVar4 = false;
    while ((-1 < iVar5 && (!bVar4))) {
      this->item_number = iVar5 + (uint)!backward * 4 + -2;
      (*(code *)**(undefined8 **)this->impl->details)();
      QPDFObjectHandle::getKey(&items,(string *)key);
      iVar5 = this->item_number;
      if (iVar5 < 0) {
LAB_00125c2c:
        pe_node.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        pe_node.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        setItemNumber(this,&pe_node,-1);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&pe_node.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        bVar4 = false;
        while ((bVar4 == false &&
               ((this_00->
                super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
                )._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)this_00))) {
          getNextKid((NNTreeIterator *)&pe_node,(PathElement *)this,
                     (bool)((char)(this->path).
                                  super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
                                  ._M_impl._M_node.super__List_node_base._M_prev + '\x10'));
          bVar4 = QPDFObjectHandle::isNull(&pe_node);
          if (bVar4) {
            std::__cxx11::
            list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>::
            pop_back(this_00);
            bVar4 = false;
          }
          else {
            std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_90,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&pe_node);
            bVar4 = deepen(this,(QPDFObjectHandle *)&local_90,!backward,false);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&pe_node.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        }
      }
      else {
        iVar6 = QPDFObjectHandle::getArrayNItems(&items);
        if (iVar6 <= iVar5) goto LAB_00125c2c;
      }
      if (this->item_number < 0) {
LAB_00125cf8:
        bVar4 = false;
      }
      else {
        (*(code *)**(undefined8 **)this->impl->details)();
        QPDFObjectHandle::getKey(&pe_node,(string *)key);
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&items,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&pe_node);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&pe_node.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        iVar5 = this->item_number;
        iVar6 = QPDFObjectHandle::getArrayNItems(&items);
        if (iVar6 <= iVar5 + 1) {
          pQVar2 = this->impl->qpdf;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&pe_node,"items array doesn\'t have enough elements",
                     (allocator<char> *)&local_70);
          warn(pQVar2,key,(string *)&pe_node);
          this_01 = (NNTreeIterator *)&pe_node;
LAB_00125cf3:
          std::__cxx11::string::~string((string *)this_01);
          goto LAB_00125cf8;
        }
        pNVar1 = this->impl->details;
        QVar7 = QPDFObjectHandle::getArrayItem(&local_a0,(int)&items);
        cVar3 = (**(code **)(*(long *)pNVar1 + 8))
                          (pNVar1,&local_a0,
                           QVar7.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_a0.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        bVar4 = true;
        if (cVar3 == '\0') {
          pQVar2 = this->impl->qpdf;
          std::__cxx11::to_string((string *)&stack0xffffffffffffffb0,this->item_number);
          std::operator+(&local_70,"item ",(string *)&stack0xffffffffffffffb0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &pe_node,&local_70," has the wrong type");
          warn(pQVar2,key,(string *)&pe_node);
          std::__cxx11::string::~string((string *)&pe_node);
          std::__cxx11::string::~string((string *)&local_70);
          this_01 = (NNTreeIterator *)&stack0xffffffffffffffb0;
          goto LAB_00125cf3;
        }
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&items.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      iVar5 = this->item_number;
    }
  }
  return;
}

Assistant:

void
NNTreeIterator::increment(bool backward)
{
    if (this->item_number < 0) {
        QTC::TC("qpdf", "NNTree increment end()");
        deepen(impl.oh, !backward, true);
        return;
    }
    bool found_valid_key = false;
    while (valid() && (!found_valid_key)) {
        this->item_number += backward ? -2 : 2;
        auto items = this->node.getKey(impl.details.itemsKey());
        if ((this->item_number < 0) || (this->item_number >= items.getArrayNItems())) {
            bool found = false;
            setItemNumber(QPDFObjectHandle(), -1);
            while (!(found || this->path.empty())) {
                auto& element = this->path.back();
                auto pe_node = getNextKid(element, backward);
                if (pe_node.isNull()) {
                    this->path.pop_back();
                } else {
                    found = deepen(pe_node, !backward, false);
                }
            }
        }
        if (this->item_number >= 0) {
            items = this->node.getKey(impl.details.itemsKey());
            if (this->item_number + 1 >= items.getArrayNItems()) {
                QTC::TC("qpdf", "NNTree skip item at end of short items");
                warn(impl.qpdf, this->node, "items array doesn't have enough elements");
            } else if (!impl.details.keyValid(items.getArrayItem(this->item_number))) {
                QTC::TC("qpdf", "NNTree skip invalid key");
                warn(
                    impl.qpdf,
                    this->node,
                    ("item " + std::to_string(this->item_number) + " has the wrong type"));
            } else {
                found_valid_key = true;
            }
        }
    }
}